

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O1

float * __thiscall
sisl::sparse_array_n<float,_1,_std::allocator<float>_>::operator()
          (sparse_array_n<float,_1,_std::allocator<float>_> *this,uint d0,...)

{
  mapped_type mVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  char in_AL;
  mapped_type *pmVar4;
  undefined8 *puVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  uint local_ec [3];
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &stack0x00000008;
  local_ec[1] = 0x10;
  local_ec[2] = 0x30;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (this->_dims[0] <= d0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "Index out of bounds!";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  uVar2 = (this->siteMap)._M_h._M_bucket_count;
  uVar6 = (ulong)(long)(int)d0 % uVar2;
  p_Var7 = (this->siteMap)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, *(uint *)&p_Var7->_M_nxt[1]._M_nxt != d0)) {
    while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)(long)(int)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar6) ||
         (p_Var8 = p_Var7, *(uint *)&p_Var3[1]._M_nxt == d0)) goto LAB_00145b48;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_00145b48:
  if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
    mVar1 = this->defaultValue;
    local_ec[0] = d0;
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->siteMap,(key_type *)local_ec);
    *pmVar4 = mVar1;
  }
  local_ec[0] = d0;
  pmVar4 = std::__detail::
           _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->siteMap,(key_type *)local_ec);
  return pmVar4;
}

Assistant:

inline T& operator()(unsigned int d0, ...) {
            unsigned int index = 0;
            va_list vl;
            va_start(vl, d0);
            index = linear_index(d0, vl);
            va_end(vl);

            auto iter = siteMap.find(index);
            if(iter == siteMap.end())
                siteMap[index] = defaultValue;

            return siteMap[index];
        }